

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void range_contains(void)

{
  undefined4 uVar1;
  roaring_bitmap_t *file;
  roaring_bitmap_t *unaff_retaddr;
  roaring_bitmap_t *bm;
  uint32_t start;
  uint32_t end;
  uint32_t in_stack_0000001c;
  uint64_t in_stack_00000020;
  uint64_t in_stack_00000028;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 uVar2;
  
  uVar2 = 0x7b9e0001;
  uVar1 = 0x7b9dffff;
  file = roaring_bitmap_from_range(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
  roaring_bitmap_printf_describe(unaff_retaddr);
  printf("\n");
  roaring_bitmap_contains_range
            ((roaring_bitmap_t *)CONCAT44(uVar2,uVar1),(uint64_t)file,
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  _assert_true((unsigned_long)unaff_retaddr,(char *)CONCAT44(uVar2,uVar1),(char *)file,
               in_stack_ffffffffffffffec);
  roaring_bitmap_contains_range
            ((roaring_bitmap_t *)CONCAT44(uVar2,uVar1),(uint64_t)file,
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  _assert_true((unsigned_long)unaff_retaddr,(char *)CONCAT44(uVar2,uVar1),(char *)file,
               in_stack_ffffffffffffffec);
  roaring_bitmap_free((roaring_bitmap_t *)0x10c3eb);
  return;
}

Assistant:

DEFINE_TEST(range_contains) {
    uint32_t end = 2073952257;
    uint32_t start = end - 2;
    roaring_bitmap_t *bm = roaring_bitmap_from_range(start, end - 1, 1);
    roaring_bitmap_printf_describe(bm);
    printf("\n");
    assert_true(roaring_bitmap_contains_range(bm, start, end - 1));
    assert_false(roaring_bitmap_contains_range(bm, start, end));
    roaring_bitmap_free(bm);
}